

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketCompression.cpp
# Opt level: O2

Result __thiscall
tonk::MessageDecompressor::Initialize(MessageDecompressor *this,uint maxCompressedMessagesBytes)

{
  uint uVar1;
  ZSTD_DCtx *dctx;
  size_t code;
  undefined8 *puVar2;
  undefined4 in_EDX;
  Result *success;
  undefined4 in_register_00000034;
  allocator local_39;
  string local_38 [32];
  
  *(undefined4 *)(CONCAT44(in_register_00000034,maxCompressedMessagesBytes) + 0x5dd0) = in_EDX;
  dctx = ZSTD_createDCtx();
  *(ZSTD_DCtx **)(CONCAT44(in_register_00000034,maxCompressedMessagesBytes) + 0x5dc8) = dctx;
  if (dctx == (ZSTD_DCtx *)0x0) {
    std::__cxx11::string::string(local_38,"ZSTD_createDCtx failed",&local_39);
    puVar2 = (undefined8 *)operator_new(0x38);
    *puVar2 = "SessionIncoming::Initialize";
    std::__cxx11::string::string((string *)(puVar2 + 1),local_38);
    *(undefined4 *)(puVar2 + 5) = 6;
    puVar2[6] = 2;
    *(undefined8 **)(this->History).Buffer = puVar2;
  }
  else {
    code = ZSTD_decompressBegin(dctx);
    uVar1 = ZSTD_isError(code);
    if (uVar1 == 0) {
      (this->History).Buffer[0] = '\0';
      (this->History).Buffer[1] = '\0';
      (this->History).Buffer[2] = '\0';
      (this->History).Buffer[3] = '\0';
      (this->History).Buffer[4] = '\0';
      (this->History).Buffer[5] = '\0';
      (this->History).Buffer[6] = '\0';
      (this->History).Buffer[7] = '\0';
      return (Result)(ErrorResult *)this;
    }
    std::__cxx11::string::string(local_38,"ZSTD_decompressBegin failed",&local_39);
    puVar2 = (undefined8 *)operator_new(0x38);
    *puVar2 = "SessionIncoming::Initialize";
    std::__cxx11::string::string((string *)(puVar2 + 1),local_38);
    *(undefined4 *)(puVar2 + 5) = 6;
    puVar2[6] = code;
    *(undefined8 **)(this->History).Buffer = puVar2;
  }
  std::__cxx11::string::~string(local_38);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result MessageDecompressor::Initialize(unsigned maxCompressedMessagesBytes)
{
    MaxCompressedMessagesBytes = maxCompressedMessagesBytes;
    DCtx = ZSTD_createDCtx();

    if (!DCtx) {
        return Result("SessionIncoming::Initialize", "ZSTD_createDCtx failed", ErrorType::Zstd);
    }

    const size_t beginResult = ZSTD_decompressBegin(DCtx);

    if (0 != ZSTD_isError(beginResult)) {
        return Result("SessionIncoming::Initialize", "ZSTD_decompressBegin failed", ErrorType::Zstd, beginResult);
    }

    return Result::Success();
}